

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O1

bool jessilib::hex_shrink_sequence_action<char,4ul,true,true>
               (char **in_write_head,basic_string_view<char,_std::char_traits<char>_> *read_view)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  char32_t in_codepoint;
  long lVar5;
  bool bVar6;
  char *local_20;
  
  sVar1 = read_view->_M_len;
  if (sVar1 == 0) {
    in_codepoint = L'\0';
    bVar6 = false;
  }
  else {
    uVar2 = 3;
    if (sVar1 - 1 < 3) {
      uVar2 = sVar1 - 1;
    }
    in_codepoint = L'\0';
    lVar3 = 0;
    do {
      lVar5 = (long)read_view->_M_str[lVar3];
      uVar4 = 0xffffffff;
      if ((-1 < lVar5) && (uVar4 = (uint)(byte)base_table[lVar5], 0xf < uVar4)) {
        uVar4 = 0xffffffff;
      }
      lVar5 = lVar3;
      if ((int)uVar4 < 0) break;
      in_codepoint = uVar4 | in_codepoint << 4;
      lVar3 = lVar3 + 1;
      lVar5 = uVar2 + 1;
    } while (uVar2 + 1 != lVar3);
    bVar6 = lVar5 == 4;
  }
  if (bVar6 != false) {
    read_view->_M_str = read_view->_M_str + 4;
    read_view->_M_len = sVar1 - 4;
    local_20 = *in_write_head;
    sVar1 = encode_codepoint_utf8<char,char*>(&local_20,in_codepoint);
    *in_write_head = *in_write_head + sVar1;
  }
  return bVar6;
}

Assistant:

constexpr bool hex_shrink_sequence_action(CharT*& in_write_head, std::basic_string_view<CharT>& read_view) {
	// Does not modify
	auto read_hex = [](uint32_t& out_value, std::basic_string_view<CharT> in_view, size_t max_digits) constexpr {
		size_t result{};
		int hex_value;
		out_value = 0;
		while (result != max_digits
			&& !in_view.empty()) {
			hex_value = as_base(in_view.front(), 16); // hexadecimal characters are always 1 unit
			if (hex_value < 0) {
				// Not a hexadecimal character; push what we have and handle this
				return result;
			}

			out_value <<= 4;
			out_value |= hex_value;

			in_view.remove_prefix(1);
			++result;
		}

		// Number of elements that are hexadecimal digits
		return result;
	};

	// Read in hex value
	uint32_t hex_value;
	size_t units_read = read_hex(hex_value, read_view, MaxDigitsV);

	// Sanity check digits read
	if constexpr(ExactDigitsV) {
		if (units_read != MaxDigitsV) {
			// We expected example MaxDigitsV digits; fail
			return false;
		}
	}
	else {
		if (units_read == 0) {
			// We didn't read any digits; fail
			return false;
		}
	}

	// We read an acceptable number of digits; write the unit and call it a day
	read_view.remove_prefix(units_read);
	if constexpr (IsUnicode) {
		in_write_head += encode_codepoint(in_write_head, hex_value);
	}
	else {
		static_assert(MaxDigitsV <= sizeof(CharT) * 2);
		*in_write_head = static_cast<CharT>(hex_value);
		++in_write_head;
	}

	return true;
}